

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int wally_base64_to_bytes(char *str_in,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  size_t srclen;
  size_t sVar1;
  ssize_t actual_len;
  size_t str_in_len;
  size_t decode_len;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  char *str_in_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((str_in == (char *)0x0) || (flags != 0)) || (bytes_out == (uchar *)0x0)) ||
     ((len == 0 || (written == (size_t *)0x0)))) {
    str_in_local._4_4_ = -2;
  }
  else {
    srclen = strlen(str_in);
    sVar1 = base64_decoded_length(srclen);
    if (len < sVar1) {
      *written = sVar1;
      str_in_local._4_4_ = 0;
    }
    else {
      sVar1 = base64_decode((char *)bytes_out,sVar1,str_in,srclen);
      if ((long)sVar1 < 0) {
        str_in_local._4_4_ = -2;
      }
      else {
        *written = sVar1;
        str_in_local._4_4_ = 0;
      }
    }
  }
  return str_in_local._4_4_;
}

Assistant:

int wally_base64_to_bytes(const char *str_in, uint32_t flags,
                          unsigned char *bytes_out, size_t len,
                          size_t *written)
{
    size_t decode_len, str_in_len;
    ssize_t actual_len;

    if (written)
        *written = 0;

    if (!str_in || flags || !bytes_out || !len || !written)
        return WALLY_EINVAL;

    str_in_len = strlen(str_in);
    decode_len = base64_decoded_length(str_in_len);
    if (len < decode_len) {
        /* Not enough space; return the amount required */
        *written = decode_len;
        return WALLY_OK;
    }

    actual_len = base64_decode((char *)bytes_out, decode_len, str_in, str_in_len);
    if (actual_len < 0)
        return WALLY_EINVAL; /* Invalid base64 data */
    *written = actual_len;
    return WALLY_OK;
}